

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<RegVmLoweredInstruction_*,_4U>::~SmallArray
          (SmallArray<RegVmLoweredInstruction_*,_4U> *this)

{
  RegVmLoweredInstruction **ppRVar1;
  
  ppRVar1 = this->data;
  if (ppRVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppRVar1 != (RegVmLoweredInstruction **)0x0) {
        (*(code *)NULLC::dealloc)(ppRVar1);
      }
    }
    else if (ppRVar1 != (RegVmLoweredInstruction **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}